

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Vec_Ptr_t * Aig_ManDfsAll(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  Aig_ManIncrementTravId(p);
  iVar7 = p->vObjs->nSize;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar7 - 1U) {
    iVar6 = iVar7;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  vNodes->pArray = ppvVar4;
  pAVar2 = p->pConst1;
  pAVar2->TravId = p->nTravIds;
  if (iVar6 == 0) {
    if (ppvVar4 == (void **)0x0) {
      ppvVar4 = (void **)malloc(0x80);
    }
    else {
      ppvVar4 = (void **)realloc(ppvVar4,0x80);
    }
    vNodes->pArray = ppvVar4;
    vNodes->nCap = 0x10;
  }
  vNodes->nSize = 1;
  *vNodes->pArray = pAVar2;
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      Aig_ManDfsAll_rec(p,(Aig_Obj_t *)pVVar5->pArray[lVar8],vNodes);
      lVar8 = lVar8 + 1;
      pVVar5 = p->vCos;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar5->pArray[lVar8];
      if (*(int *)((long)pvVar3 + 0x20) != p->nTravIds) {
        uVar1 = vNodes->nCap;
        if (vNodes->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar1 * 2;
            if (iVar7 <= (int)uVar1) goto LAB_006b5130;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
            }
          }
          vNodes->pArray = ppvVar4;
          vNodes->nCap = iVar7;
        }
LAB_006b5130:
        iVar7 = vNodes->nSize;
        vNodes->nSize = iVar7 + 1;
        vNodes->pArray[iVar7] = pvVar3;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  if (vNodes->nSize != p->vObjs->nSize - p->nDeleted) {
    __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                  ,0xf4,"Vec_Ptr_t *Aig_ManDfsAll(Aig_Man_t *)");
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsAll( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsAll_rec( p, pObj, vNodes );
    Aig_ManForEachCi( p, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vNodes, pObj );
    assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}